

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::GuessLibrarySOName(string *fullPath,string *soname)

{
  size_type sVar1;
  bool bVar2;
  string name;
  cmELF elf;
  string local_80;
  cmELF local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  cmELF::cmELF(&local_60,(fullPath->_M_dataplus)._M_p);
  bVar2 = cmELF::Valid(&local_60);
  if (bVar2) {
    bVar2 = cmELF::GetSOName(&local_60,soname);
  }
  else {
    bVar2 = cmsys::SystemTools::FileIsSymlink(fullPath);
    if (bVar2) {
      bVar2 = cmsys::SystemTools::ReadSymlink(fullPath,soname);
      if (bVar2) {
        cmsys::SystemTools::GetFilenamePath(&local_80,soname);
        sVar1 = local_80._M_string_length;
        std::__cxx11::string::~string((string *)&local_80);
        if (sVar1 == 0) {
          cmsys::SystemTools::GetFilenameName(&local_80,fullPath);
          if (local_80._M_string_length < soname->_M_string_length) {
            std::__cxx11::string::substr((ulong)&local_38,(ulong)soname);
            bVar2 = std::operator==(&local_38,&local_80);
            std::__cxx11::string::~string((string *)&local_38);
          }
          else {
            bVar2 = false;
          }
          std::__cxx11::string::~string((string *)&local_80);
          goto LAB_002b88db;
        }
      }
    }
    bVar2 = false;
  }
LAB_002b88db:
  cmELF::~cmELF(&local_60);
  return bVar2;
}

Assistant:

bool cmSystemTools::GuessLibrarySOName(std::string const& fullPath,
                                       std::string& soname)
{
  // For ELF shared libraries use a real parser to get the correct
  // soname.
#if defined(CMAKE_USE_ELF_PARSER)
  cmELF elf(fullPath.c_str());
  if(elf)
    {
    return elf.GetSOName(soname);
    }
#endif

  // If the file is not a symlink we have no guess for its soname.
  if(!cmSystemTools::FileIsSymlink(fullPath))
    {
    return false;
    }
  if(!cmSystemTools::ReadSymlink(fullPath, soname))
    {
    return false;
    }

  // If the symlink has a path component we have no guess for the soname.
  if(!cmSystemTools::GetFilenamePath(soname).empty())
    {
    return false;
    }

  // If the symlink points at an extended version of the same name
  // assume it is the soname.
  std::string name = cmSystemTools::GetFilenameName(fullPath);
  if(soname.length() > name.length() &&
     soname.substr(0, name.length()) == name)
    {
    return true;
    }
  return false;
}